

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monochrome_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c4c24d::MonochromeRealtimeTest_TestMonochromeEncoding_Test::TestBody
          (MonochromeRealtimeTest_TestMonochromeEncoding_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  char *in_RDI;
  AssertionResult gtest_ar;
  int initial_chroma_value;
  const_iterator iter;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffec4;
  int *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed8;
  undefined2 in_stack_fffffffffffffedc;
  undefined1 in_stack_fffffffffffffede;
  undefined1 in_stack_fffffffffffffedf;
  string *file_name;
  Type type;
  HasNewFatalFailureHelper *in_stack_fffffffffffffef0;
  uint in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff08;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_d8 [2];
  Message *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int iVar5;
  HasNewFatalFailureHelper local_b8;
  undefined1 local_89 [33];
  undefined1 local_68 [104];
  
  file_name = (string *)local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_89 + 1),"hantro_collage_w352h288.yuv",(allocator *)file_name);
  uVar4 = 0x1e;
  uVar3 = 0;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)in_stack_fffffffffffffef0,file_name,(uint)((ulong)in_RDI >> 0x20),
             (uint)in_RDI,
             CONCAT13(in_stack_fffffffffffffedf,
                      CONCAT12(in_stack_fffffffffffffede,in_stack_fffffffffffffedc)),
             in_stack_fffffffffffffed8,in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
  std::__cxx11::string::~string((string *)(local_89 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_89);
  in_RDI[0x3e0] = '\0';
  in_RDI[0x3e1] = '\0';
  in_RDI[0x3e2] = '\x01';
  in_RDI[0x3e3] = '\0';
  in_RDI[0x3e4] = '\0';
  in_RDI[0x3e5] = '\0';
  in_RDI[0x3e6] = '\0';
  in_RDI[999] = '\0';
  in_RDI[0x100] = '\x01';
  in_RDI[0x101] = '\0';
  in_RDI[0x102] = '\0';
  in_RDI[0x103] = '\0';
  in_RDI[0xb8] = '(';
  in_RDI[0xb9] = '\0';
  in_RDI[0xba] = '\0';
  in_RDI[0xbb] = '\0';
  in_RDI[0xcc] = 'p';
  in_RDI[0xcd] = '\x17';
  in_RDI[0xce] = '\0';
  in_RDI[0xcf] = '\0';
  in_RDI[0xd0] = -0x60;
  in_RDI[0xd1] = '\x0f';
  in_RDI[0xd2] = '\0';
  in_RDI[0xd3] = '\0';
  in_RDI[0xd4] = -0x78;
  in_RDI[0xd5] = '\x13';
  in_RDI[0xd6] = '\0';
  in_RDI[0xd7] = '\0';
  uVar1 = testing::internal::AlwaysTrue();
  type = (Type)((ulong)file_name >> 0x20);
  if ((bool)uVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(in_stack_fffffffffffffef0)
    ;
    in_stack_fffffffffffffede = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffede) {
      (**(code **)(*(long *)(in_RDI + 0x18) + 0x10))(in_RDI + 0x18,local_68);
    }
    bVar2 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_b8);
    if (bVar2) {
      in_stack_ffffffffffffff44 = 2;
    }
    else {
      in_stack_ffffffffffffff44 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_fffffffffffffec4,uVar4));
    type = (Type)((ulong)file_name >> 0x20);
    if (in_stack_ffffffffffffff44 == 0) {
      iVar5 = in_stack_ffffffffffffff44;
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)CONCAT44(in_stack_fffffffffffffebc,uVar3));
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 CONCAT44(in_stack_fffffffffffffec4,uVar4),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 CONCAT44(in_stack_fffffffffffffebc,uVar3));
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (local_d8);
      while( true ) {
        std::vector<int,_std::allocator<int>_>::end
                  ((vector<int,_std::allocator<int>_> *)CONCAT44(in_stack_fffffffffffffebc,uVar3));
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                            *)CONCAT44(in_stack_fffffffffffffec4,uVar4),
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_fffffffffffffebc,uVar3));
        if (!bVar2) break;
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator*(local_d8);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((char *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffede,
                                                   CONCAT24(in_stack_fffffffffffffedc,
                                                            in_stack_ffffffffffffff44))),
                   in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                   (int *)CONCAT44(in_stack_fffffffffffffec4,uVar4));
        bVar2 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)&stack0xffffffffffffff00);
        if (!bVar2) {
          testing::Message::Message((Message *)in_stack_fffffffffffffef0);
          in_stack_fffffffffffffed0 =
               testing::AssertionResult::failure_message((AssertionResult *)0x8bb01c);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffef0,(Type)((ulong)file_name >> 0x20),
                     in_RDI,CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffede,
                                                    in_stack_fffffffffffffedc)),
                     in_stack_fffffffffffffed0);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(iVar5,in_stack_ffffffffffffff40),
                     in_stack_ffffffffffffff38);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffec4,uVar4));
          testing::Message::~Message((Message *)0x8bb06a);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x8bb0cc);
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(local_d8);
      }
      goto LAB_008bb0f2;
    }
    if (in_stack_ffffffffffffff44 != 2) goto LAB_008bb0f2;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffef0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffef0,type,in_RDI,
             CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffede,in_stack_fffffffffffffedc)),
             in_stack_fffffffffffffed0);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffec4,uVar4));
  testing::Message::~Message((Message *)0x8baf0c);
LAB_008bb0f2:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x8bb0ff);
  return;
}

Assistant:

TEST_P(MonochromeRealtimeTest, TestMonochromeEncoding) {
  ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                       30, 1, 0, 30);
  init_flags_ = AOM_CODEC_USE_PSNR;
  // Set monochrome encoding flag
  cfg_.monochrome = 1;
  // Run at low bitrate.
  cfg_.rc_target_bitrate = 40;
  cfg_.rc_buf_sz = 6000;
  cfg_.rc_buf_initial_sz = 4000;
  cfg_.rc_buf_optimal_sz = 5000;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));

#if CONFIG_AV1_DECODER
  // Check that the chroma planes are equal across all frames
  std::vector<int>::const_iterator iter = chroma_value_list_.begin();
  int initial_chroma_value = *iter;
  for (; iter != chroma_value_list_.end(); ++iter) {
    // Check that all decoded frames have the same constant chroma planes.
    EXPECT_EQ(*iter, initial_chroma_value);
  }
#endif
}